

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

bool cmsys::SystemTools::Split
               (string *str,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *lines,char separator)

{
  size_type sVar1;
  ulong uVar2;
  value_type local_a8;
  undefined4 local_88;
  value_type local_78;
  long local_58;
  size_type rpos;
  size_type lpos;
  string data;
  char separator_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *lines_local;
  string *str_local;
  
  data.field_2._M_local_buf[0xf] = separator;
  std::__cxx11::string::string((string *)&lpos,(string *)str);
  rpos = 0;
  do {
    sVar1 = rpos;
    uVar2 = std::__cxx11::string::length();
    if (uVar2 <= sVar1) {
      str_local._7_1_ = true;
LAB_0016638e:
      local_88 = 1;
      std::__cxx11::string::~string((string *)&lpos);
      return str_local._7_1_;
    }
    local_58 = std::__cxx11::string::find_first_of
                         ((char)&lpos,(ulong)(uint)(int)data.field_2._M_local_buf[0xf]);
    if (local_58 == -1) {
      std::__cxx11::string::substr((ulong)&local_78,(ulong)&lpos);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(lines,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      str_local._7_1_ = false;
      goto LAB_0016638e;
    }
    std::__cxx11::string::substr((ulong)&local_a8,(ulong)&lpos);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(lines,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    rpos = local_58 + 1;
  } while( true );
}

Assistant:

bool SystemTools::Split(const std::string& str,
                        std::vector<std::string>& lines, char separator)
{
  std::string data(str);
  std::string::size_type lpos = 0;
  while (lpos < data.length()) {
    std::string::size_type rpos = data.find_first_of(separator, lpos);
    if (rpos == std::string::npos) {
      // String ends at end of string without a separator.
      lines.push_back(data.substr(lpos));
      return false;
    } else {
      // String ends in a separator, remove the character.
      lines.push_back(data.substr(lpos, rpos - lpos));
    }
    lpos = rpos + 1;
  }
  return true;
}